

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DefaultFBOMultisampleCase::renderTriangle
          (DefaultFBOMultisampleCase *this,Vec2 *p0,Vec2 *p1,Vec2 *p2,Vec4 *c0,Vec4 *c1,Vec4 *c2)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  VertexArray vao;
  Buffer colBuf;
  Buffer vtxBuf;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  float local_38;
  float fStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  float local_28;
  float fStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  long lVar3;
  
  local_48 = p0->m_data[0];
  fStack_44 = p0->m_data[1];
  uStack_40 = 0;
  uStack_3c = 0x3f800000;
  local_38 = p1->m_data[0];
  fStack_34 = p1->m_data[1];
  uStack_30 = 0;
  uStack_2c = 0x3f800000;
  local_28 = p2->m_data[0];
  fStack_24 = p2->m_data[1];
  uStack_20 = 0;
  uStack_1c = 0x3f800000;
  local_78 = *(undefined8 *)c0->m_data;
  uStack_70 = *(undefined8 *)(c0->m_data + 2);
  local_68 = *(undefined8 *)c1->m_data;
  uStack_60 = *(undefined8 *)(c1->m_data + 2);
  local_58 = c2->m_data[0];
  fStack_54 = c2->m_data[1];
  fStack_50 = c2->m_data[2];
  fStack_4c = c2->m_data[3];
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&vtxBuf,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&colBuf,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  (**(code **)(lVar3 + 0xd8))(vao.super_ObjectWrapper.m_object);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"bindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x144);
  (**(code **)(lVar3 + 0x40))(0x8892,vtxBuf.super_ObjectWrapper.m_object);
  (**(code **)(lVar3 + 0x150))(0x8892,0x30,&local_48,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"vtx buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x148);
  (**(code **)(lVar3 + 0x610))(this->m_attrPositionLoc);
  (**(code **)(lVar3 + 0x19f0))(this->m_attrPositionLoc,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"vtx vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x14c);
  (**(code **)(lVar3 + 0x40))(0x8892,colBuf.super_ObjectWrapper.m_object);
  (**(code **)(lVar3 + 0x150))(0x8892,0x30,&local_78,0x88e4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"col buf",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x150);
  (**(code **)(lVar3 + 0x610))(this->m_attrColorLoc);
  (**(code **)(lVar3 + 0x19f0))(this->m_attrColorLoc,4,0x1406,0,0,0);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"col vertexAttribPointer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x154);
  (**(code **)(lVar3 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar3 + 0x538))(4,0,3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"drawArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fMultisampleTests.cpp"
                  ,0x158);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&colBuf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vtxBuf.super_ObjectWrapper);
  return;
}

Assistant:

void DefaultFBOMultisampleCase::renderTriangle (const Vec2& p0, const Vec2& p1, const Vec2& p2, const Vec4& c0, const Vec4& c1, const Vec4& c2) const
{
	renderTriangle(Vec3(p0.x(), p0.y(), 0.0f),
				   Vec3(p1.x(), p1.y(), 0.0f),
				   Vec3(p2.x(), p2.y(), 0.0f),
				   c0, c1, c2);
}